

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O2

void __thiscall libDAI::HAK::HAK(HAK *this,FactorGraph *fg,Properties *opts)

{
  value vVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Rb_tree_node_base *p_Var5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ostream *poVar6;
  undefined4 extraout_var_06;
  Exception *pEVar7;
  _Self __tmp;
  ulong uVar8;
  Var *n;
  pointer ns;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> cl;
  VarSet i0d;
  VarSet local_210;
  VarSet local_1f0;
  RegionGraph rg;
  
  DAIAlg<libDAI::RegionGraph>::DAIAlg(&this->super_DAIAlgRG,opts);
  (this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061e930;
  this->_iterations = 0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_muab).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)&this->Props = 0;
  (this->Props).tol = 0.0;
  (this->Props).maxiter = 0;
  (this->Props).verbose = 0;
  (this->Props).damping = 0.0;
  *(undefined8 *)&(this->Props).doubleloop = 0;
  (this->Props).loopdepth = 0;
  this->_maxdiff = 0.0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_muab).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_muab).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_muab).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_muba).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_muba).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_muba).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = initProps(this);
  if (!bVar3) {
    pEVar7 = (Exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rg,"hak.cpp, line 118",(allocator<char> *)&i0d);
    Exception::Exception(pEVar7,8,(string *)&rg);
    __cxa_throw(pEVar7,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  cl.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cl.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cl.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vVar1 = (this->Props).clusters.v;
  if (vVar1 == MIN) {
    FactorGraph::Cliques((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)&rg,fg);
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::_M_move_assign(&cl,&rg);
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector
              ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)&rg);
  }
  else if (vVar1 == LOOP) {
    FactorGraph::Cliques((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)&rg,fg);
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::_M_move_assign(&cl,&rg);
    std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector
              ((vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *)&rg);
    rg._fg.super_GraphicalModel._8_8_ = &rg.super_GraphicalModel._normType;
    rg.super_GraphicalModel._normType = NORMPROB;
    rg._fg.super_GraphicalModel._vptr_GraphicalModel = (_func_int **)0x0;
    rg._fg._fg._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    rg._fg._fg._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)rg._fg.super_GraphicalModel._8_8_;
    iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[7])(fg);
    n = *(Var **)CONCAT44(extraout_var_01,iVar4);
    while( true ) {
      iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[7])(fg);
      if (n == *(Var **)(CONCAT44(extraout_var_02,iVar4) + 8)) break;
      (*(fg->super_GraphicalModel)._vptr_GraphicalModel[0xe])(&i0d,fg,n);
      if (1 < (this->Props).loopdepth) {
        VarSet::VarSet(&local_1f0,n);
        sVar2 = (this->Props).loopdepth;
        (*(fg->super_GraphicalModel)._vptr_GraphicalModel[0xe])(&local_210,fg,n);
        findLoopClusters(this,fg,(set<libDAI::VarSet,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>
                                  *)&rg,&local_1f0,n,sVar2 - 1,&local_210);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_210);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_1f0);
      }
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&i0d);
      n = n + 1;
    }
    for (p_Var5 = (_Rb_tree_node_base *)rg._fg.super_GraphicalModel._8_8_;
        p_Var5 != (_Rb_tree_node_base *)&rg.super_GraphicalModel._normType;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::push_back
                (&cl,(value_type *)(p_Var5 + 1));
    }
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
    if (2 < CONCAT44(extraout_var_03,iVar4)) {
      poVar6 = std::operator<<((ostream *)&std::cout,"HAK uses the following clusters: ");
      std::endl<char,std::char_traits<char>>(poVar6);
      for (ns = cl.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
                super__Vector_impl_data._M_start;
          ns != cl.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
                super__Vector_impl_data._M_finish; ns = ns + 1) {
        poVar6 = libDAI::operator<<((ostream *)&std::cout,ns);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
    }
    std::
    _Rb_tree<libDAI::VarSet,_libDAI::VarSet,_std::_Identity<libDAI::VarSet>,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>
    ::~_Rb_tree((_Rb_tree<libDAI::VarSet,_libDAI::VarSet,_std::_Identity<libDAI::VarSet>,_std::less<libDAI::VarSet>,_std::allocator<libDAI::VarSet>_>
                 *)&rg);
  }
  else {
    if (vVar1 != DELTA) {
      pEVar7 = (Exception *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rg,"hak.cpp, line 142",(allocator<char> *)&i0d);
      Exception::Exception(pEVar7,2,(string *)&rg);
      __cxa_throw(pEVar7,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar8 = 0;
    while( true ) {
      iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
      if (CONCAT44(extraout_var,iVar4) <= uVar8) break;
      iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[6])(fg,uVar8);
      (*(fg->super_GraphicalModel)._vptr_GraphicalModel[0xd])
                (&rg,fg,CONCAT44(extraout_var_00,iVar4));
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::emplace_back<libDAI::VarSet>
                (&cl,(VarSet *)&rg);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&rg);
      uVar8 = uVar8 + 1;
    }
  }
  RegionGraph::RegionGraph(&rg,fg,&cl);
  iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  RegionGraph::operator=((RegionGraph *)CONCAT44(extraout_var_04,iVar4),&rg);
  constructMessages(this);
  iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])();
  if (2 < CONCAT44(extraout_var_05,iVar4)) {
    poVar6 = std::operator<<((ostream *)&std::cout,"HAK regiongraph: ");
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    poVar6 = libDAI::operator<<(poVar6,(RegionGraph *)CONCAT44(extraout_var_06,iVar4));
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  RegionGraph::~RegionGraph(&rg);
  std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector(&cl);
  return;
}

Assistant:

HAK::HAK(const FactorGraph & fg, const Properties &opts) : DAIAlgRG(opts), Props(), _maxdiff(0.0), _iterations(0UL), _Qa(), _Qb(), _muab(), _muba() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        vector<VarSet> cl;
        if( Props.clusters == ClustersType::MIN ) {
            cl = fg.Cliques();
        } else if( Props.clusters == ClustersType::DELTA ) {
            for( size_t i = 0; i < fg.nrVars(); i++ )
                cl.push_back(fg.Delta(fg.var(i))); 
        } else if( Props.clusters == ClustersType::LOOP ) {
            cl = fg.Cliques();
            set<VarSet> scl;
            for( vector<Var>::const_iterator i0 = fg.vars().begin(); i0 != fg.vars().end(); i0++ ) {
                VarSet i0d = fg.delta(*i0);
                if( Props.loopdepth > 1 )
                    findLoopClusters( fg, scl, *i0, *i0, Props.loopdepth - 1, fg.delta(*i0) );
            }
            for( set<VarSet>::const_iterator c = scl.begin(); c != scl.end(); c++ )
                cl.push_back(*c);
            if( Verbose() >= 3 ) {
                cout << "HAK uses the following clusters: " << endl;
                for( vector<VarSet>::const_iterator cli = cl.begin(); cli != cl.end(); cli++ )
                    cout << *cli << endl;
            }
        } else
            DAI_THROW(UNKNOWN_PROPERTY_TYPE);

        RegionGraph rg(fg,cl);
        grm() = rg;
        constructMessages();

    /*  if( (Props.clusters == ClustersType::LOOP) ) {
             double c_sum = 0.0;
             for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
                 c_sum += grm().OR(alpha).c();
             for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
                 c_sum += grm().IR(beta).c();
             cout << "Sum of cluster numbers: " << c_sum << endl;
        }*/

        if( Verbose() >= 3 )
            cout << "HAK regiongraph: " << grm() << endl;
    }